

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# functions.cpp
# Opt level: O2

DHT_action DHT_Request(DHT_action akv)

{
  addressInfo server;
  ulong uVar1;
  ostream *poVar2;
  ulong uVar3;
  addressInfo server_00;
  type *in_R8;
  ulong uVar4;
  DHT_action DVar5;
  DHT_action action;
  DHT_action action_00;
  ulong local_180;
  int local_178;
  data_union local_170;
  ulong local_150;
  array<unsigned_char,_18UL> return_tracker_message;
  string local_130;
  ulong local_110;
  io_context io_context;
  array<unsigned_char,_4UL> key_message;
  results_type endpoints;
  error_code error;
  socket socket;
  resolver resolver;
  
  asio::io_context::io_context(&io_context);
  asio::detail::
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<asio::io_context>(&resolver.impl_,&io_context,(type *)0x0);
  ip_tostr_abi_cxx11_((string *)&socket,(array<unsigned_char,_4UL>)0x100007f);
  std::__cxx11::to_string((string *)&local_170.base,3000);
  asio::ip::
  basic_resolver<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::resolve(&endpoints,&resolver,(string *)&socket,(string *)&local_170.base);
  std::__cxx11::string::~string((string *)&local_170.base);
  std::__cxx11::string::~string((string *)&socket);
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.service_ =
       asio::use_service<asio::detail::reactive_socket_service<asio::ip::tcp>>(&io_context);
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.target_ =
       &socket.
        super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
        .impl_.executor_;
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.implementation_.protocol_.family_ = 2;
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.target_fns_ =
       (target_fns *)
       asio::execution::detail::any_executor_base::
       target_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(bool,std::enable_if<!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value,void>::type*)
       ::fns_with_execute;
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.object_fns_ =
       (object_fns *)
       asio::execution::detail::any_executor_base::
       object_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>(std::enable_if<(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,void>::value)&&(!is_same<asio::io_context::basic_executor_type<std::allocator<void>,0u>,std::shared_ptr<void>>::value),void>::type*)
       ::fns;
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.object_._12_4_ = 0;
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.prop_fns_ =
       (prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
        *)asio::execution::
          any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
          ::prop_fns_table<asio::io_context::basic_executor_type<std::allocator<void>,0u>>()::fns;
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.implementation_.super_base_implementation_type.socket_ = -1;
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.implementation_.super_base_implementation_type.state_ = '\0';
  socket.
  super_basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  .impl_.executor_.super_any_executor_base.object_.__align =
       (anon_struct_8_0_00000001_for___align)&io_context;
  asio::
  connect<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>,asio::ip::basic_resolver_results<asio::ip::tcp>>
            ((endpoint *)&local_170.base,(asio *)&socket,
             (basic_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)&endpoints,(basic_resolver_results<asio::ip::tcp> *)0x0,in_R8);
  error._M_value = 0;
  error._M_cat = (error_category *)std::_V2::system_category();
  local_170._0_8_ = &key_message;
  key_message._M_elems = (_Type)akv.key;
  local_170.base.sa_data[6] = '\x04';
  local_170.base.sa_data[7] = '\0';
  local_170.base.sa_data[8] = '\0';
  local_170.base.sa_data[9] = '\0';
  local_170.base.sa_data[10] = '\0';
  local_170.base.sa_data[0xb] = '\0';
  local_170.base.sa_data[0xc] = '\0';
  local_170.base.sa_data[0xd] = '\0';
  asio::
  write<asio::basic_stream_socket<asio::ip::tcp,asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>>,asio::mutable_buffers_1,asio::detail::transfer_all_t>
            (&socket,&local_170,&error,0);
  local_170._0_8_ = &return_tracker_message;
  local_170.base.sa_data[6] = '\x12';
  local_170.base.sa_data[7] = '\0';
  local_170.base.sa_data[8] = '\0';
  local_170.base.sa_data[9] = '\0';
  local_170.base.sa_data[10] = '\0';
  local_170.base.sa_data[0xb] = '\0';
  local_170.base.sa_data[0xc] = '\0';
  local_170.base.sa_data[0xd] = '\0';
  asio::
  basic_stream_socket<asio::ip::tcp,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::read_some<asio::mutable_buffers_1>(&socket,(mutable_buffers_1 *)&local_170.base,&error);
  server._2_4_ = return_tracker_message._M_elems._8_4_;
  server.IPAddress._M_elems[0] = return_tracker_message._M_elems[6];
  server.IPAddress._M_elems[1] = return_tracker_message._M_elems[7];
  DVar5 = Server_Request((addressInfo)return_tracker_message._M_elems._0_6_,akv);
  action.value = DVar5.value;
  local_110 = DVar5._0_8_;
  DVar5 = Server_Request(server,akv);
  action_00.value = DVar5.value;
  local_150 = DVar5._0_8_;
  server_00 = (addressInfo)
              (((uint6)stack0xfffffffffffffec8 << 0x20) +
              (uint6)(uint)return_tracker_message._M_elems._12_4_);
  DVar5 = Server_Request(server_00,akv);
  uVar3 = local_110;
  uVar4 = 0xffffffff00000000;
  if (((((int)local_110 == (int)local_150) && ((local_150 ^ local_110) >> 0x20 == 0)) &&
      (action.value == action_00.value)) &&
     (((local_180._0_4_ = DVar5.action, (int)local_110 == (int)local_180 &&
       (local_180 = DVar5._0_8_, (local_180 ^ local_110) >> 0x20 == 0)) &&
      (local_178 = DVar5.value, local_110 < 0xffffffff00000000 && action.value == local_178)))) {
    uVar4 = local_110 & 0xffffffff00000000;
    uVar3 = local_110 & 0xffffffff;
  }
  else if (local_110 < 0xffffffff00000000) {
    poVar2 = std::operator<<((ostream *)&std::cout,"\nSERVER RESPONSES DO NOT MATCH:");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"primaryServer: ");
    addressInfo_tostr_abi_cxx11_
              ((string *)&local_170.base,(addressInfo)return_tracker_message._M_elems._0_6_);
    poVar2 = std::operator<<(poVar2,(string *)&local_170.base);
    poVar2 = std::operator<<(poVar2,"  --  ");
    uVar1 = local_110;
    local_110._0_4_ = (undefined4)uVar3;
    local_110._4_4_ = SUB84(uVar3,4);
    action.action = (undefined4)local_110;
    action.key = local_110._4_4_;
    local_110 = uVar1;
    dht_action_tostr_abi_cxx11_(&local_130,action);
    poVar2 = std::operator<<(poVar2,(string *)&local_130);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_170.base);
    poVar2 = std::operator<<((ostream *)&std::cout,"neighborServer1: ");
    addressInfo_tostr_abi_cxx11_((string *)&local_170.base,server);
    poVar2 = std::operator<<(poVar2,(string *)&local_170.base);
    poVar2 = std::operator<<(poVar2,"  --  ");
    action_00.action = (int)local_150;
    action_00.key = local_150._4_4_;
    dht_action_tostr_abi_cxx11_(&local_130,action_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_130);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_170.base);
    poVar2 = std::operator<<((ostream *)&std::cout,"neighborServer2: ");
    addressInfo_tostr_abi_cxx11_((string *)&local_170.base,server_00);
    poVar2 = std::operator<<(poVar2,(string *)&local_170.base);
    poVar2 = std::operator<<(poVar2,"  --  ");
    dht_action_tostr_abi_cxx11_(&local_130,DVar5);
    poVar2 = std::operator<<(poVar2,(string *)&local_130);
    std::endl<char,std::char_traits<char>>(poVar2);
    uVar3 = 0xffffffff;
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_170.base);
    action.value = -1;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"\nNO SERVERS ACTIVE IN THE DHT\n");
    std::endl<char,std::char_traits<char>>(poVar2);
    action.value = -1;
    uVar3 = 0xffffffff;
  }
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl((io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     *)&socket);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&endpoints.super_basic_resolver_iterator<asio::ip::tcp>.values_.
              super___shared_ptr<std::vector<asio::ip::basic_resolver_entry<asio::ip::tcp>,_std::allocator<asio::ip::basic_resolver_entry<asio::ip::tcp>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  asio::detail::
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~io_object_impl(&resolver.impl_);
  asio::execution_context::~execution_context(&io_context.super_execution_context);
  DVar5.value = action.value;
  DVar5.action = (int)(uVar3 | uVar4);
  DVar5.key = (int)((uVar3 | uVar4) >> 0x20);
  return DVar5;
}

Assistant:

DHT_action DHT_Request(DHT_action akv) {
	addressInfo trackerServerInfo = { .IPAddress = {127, 0, 0, 1}, .port = 3000 };
	// std::cout << "SERVER: " << addressInfo_tostr(trackerServerInfo) << ", " << dht_action_tostr(akv) << std::endl;
	using asio::ip::tcp;

	asio::io_context io_context;
	tcp::resolver resolver(io_context);
	tcp::resolver::results_type endpoints = resolver.resolve(ip_tostr(trackerServerInfo.IPAddress), std::to_string(trackerServerInfo.port));

	tcp::socket socket(io_context);
	asio::connect(socket, endpoints);

	asio::error_code error;
	std::array<uint8_t, 4> key_message; // we're just sending the key to the tracker
	memcpy(&key_message, &akv.key, sizeof(int));

	asio::write(socket, asio::buffer(key_message), error);
	std::array<uint8_t, 3*sizeof(addressInfo)> return_tracker_message; // we're receiving an array of 3 addressInfo structs
	size_t len = socket.read_some(asio::buffer(return_tracker_message), error);
	std::array<addressInfo, 3> response;
	memcpy(&response, &return_tracker_message, 3*sizeof(addressInfo));
	addressInfo server = response[0];
	addressInfo neighbor1 = response[1];
	addressInfo neighbor2 = response[2];
	
	// NOW THAT WE HAVE THE PORT, CONNECT TO SERVER
	DHT_action primaryServer = Server_Request(server, akv);
	DHT_action neighborServer1 = Server_Request(neighbor1, akv);
	DHT_action neighborServer2 = Server_Request(neighbor2, akv);
	
	if (primaryServer == neighborServer1  && primaryServer == neighborServer2 && primaryServer.key != -1) {
		return primaryServer;
	}
	else if (primaryServer.key == -1) {
		std::cout << "\nNO SERVERS ACTIVE IN THE DHT\n" << std::endl;
		return (DHT_action){.action = -1, .key = -1, .value = -1};
	}
	else {
		std::cout << "\nSERVER RESPONSES DO NOT MATCH:" << std::endl;
		std::cout << "primaryServer: " << addressInfo_tostr(server) << "  --  " << dht_action_tostr(primaryServer) << std::endl;
		std::cout << "neighborServer1: " << addressInfo_tostr(neighbor1) << "  --  " << dht_action_tostr(neighborServer1) << std::endl;
		std::cout << "neighborServer2: " << addressInfo_tostr(neighbor2) << "  --  " << dht_action_tostr(neighborServer2) << std::endl;
		return (DHT_action){.action = -1, .key = -1, .value = -1};
	}
}